

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O0

int raplcap_pd_is_zone_enabled(raplcap *rc,uint32_t pkg,uint32_t die,raplcap_zone zone)

{
  int iVar1;
  raplcap_msr *ctx;
  off_t msr_00;
  bool local_51;
  off_t msr;
  raplcap_msr *state;
  int iStack_38;
  int ret;
  int en [2];
  uint64_t msrval;
  raplcap_zone zone_local;
  uint32_t die_local;
  uint32_t pkg_local;
  raplcap *rc_local;
  
  _iStack_38 = 0x100000001;
  ctx = get_state(rc,pkg,die);
  msr_00 = zone_to_msr_offset(zone,ZONE_OFFSETS_PL);
  if (((ctx == (raplcap_msr *)0x0) || (msr_00 < 0)) ||
     (iVar1 = msr_sys_read(ctx->sys,(uint64_t *)en,pkg,die,msr_00), iVar1 != 0)) {
    rc_local._4_4_ = 0xffffffff;
  }
  else {
    msr_is_zone_enabled(&ctx->ctx,zone,(uint64_t)en,&iStack_38,&ret);
    local_51 = false;
    if (iStack_38 != 0) {
      local_51 = ret != 0;
    }
    rc_local._4_4_ = (uint)local_51;
    if (rc_local._4_4_ != 0) {
      raplcap_msr_is_zone_clamped(rc,pkg,zone);
    }
  }
  return rc_local._4_4_;
}

Assistant:

int raplcap_pd_is_zone_enabled(const raplcap* rc, uint32_t pkg, uint32_t die, raplcap_zone zone) {
  uint64_t msrval;
  int en[2] = { 1, 1 };
  int ret;
  const raplcap_msr* state = get_state(rc, pkg, die);
  const off_t msr = zone_to_msr_offset(zone, ZONE_OFFSETS_PL);
  if (state == NULL || msr < 0 || msr_sys_read(state->sys, &msrval, pkg, die, msr)) {
    return -1;
  }
  msr_is_zone_enabled(&state->ctx, zone, msrval, &en[0], &en[1]);
  ret = en[0] && en[1];
  if (ret && !raplcap_msr_is_zone_clamped(rc, pkg, zone)) {
    raplcap_log(INFO, "Zone is enabled but clamping is not\n");
  }
  raplcap_log(DEBUG, "raplcap_pd_is_zone_enabled: pkg=%"PRIu32", die=%"PRIu32", zone=%d, enabled=%d\n",
              pkg, die, zone, ret);
  return ret;
}